

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointElement.cpp
# Opt level: O0

bool __thiscall
iDynTree::JointElement::setAttributes
          (JointElement *this,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
          *attributes)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_true>
  __lhs;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  string errStr;
  const_iterator found;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
  *in_stack_fffffffffffffe68;
  allocator<char> *__a;
  char *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_true>
  local_b8;
  allocator<char> local_a9;
  string local_a8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_true>
  local_88;
  string local_80 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_true>
  local_60 [3];
  allocator<char> local_41;
  string local_40 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_true>
  local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  byte local_1;
  
  __a = &local_41;
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,__a);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
       ::find(in_stack_fffffffffffffe68,(key_type *)0x19e8a0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  local_60[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
       ::end(in_stack_fffffffffffffe68);
  bVar1 = std::__detail::operator!=(&local_20,local_60);
  if (bVar1) {
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_false,_true>
    ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_false,_true>
                  *)0x19e90e);
    std::__shared_ptr_access<iDynTree::XMLAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<iDynTree::XMLAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x19e91a);
    iDynTree::XMLAttribute::value_abi_cxx11_();
    std::__cxx11::string::operator=((string *)(in_RDI + 0x20),local_80);
    std::__cxx11::string::~string(local_80);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,__a);
  __lhs._M_cur = (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
                 ::find(in_stack_fffffffffffffe68,(key_type *)0x19e9e4);
  local_88._M_cur = __lhs._M_cur;
  local_20._M_cur = __lhs._M_cur;
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  local_b8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
       ::end(in_stack_fffffffffffffe68);
  bVar1 = std::__detail::operator!=(&local_20,&local_b8);
  if (bVar1) {
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_false,_true>
    ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_false,_true>
                  *)0x19ea62);
    std::__shared_ptr_access<iDynTree::XMLAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<iDynTree::XMLAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x19ea6e);
    iDynTree::XMLAttribute::value_abi_cxx11_();
    std::__cxx11::string::operator=((string *)(in_RDI + 0x40),local_d8);
    std::__cxx11::string::~string(local_d8);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs._M_cur,(char *)in_stack_fffffffffffffe68);
    if ((((bVar1) &&
         (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs._M_cur,(char *)in_stack_fffffffffffffe68), bVar1)) &&
        (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__lhs._M_cur,(char *)in_stack_fffffffffffffe68), bVar1)) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs._M_cur,(char *)in_stack_fffffffffffffe68), bVar1)) {
      std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::operator+(local_18,(char *)__lhs._M_cur);
      std::operator+(local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs._M_cur);
      std::operator+(local_18,(char *)__lhs._M_cur);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("JointElement","setAttributes",pcVar2);
      local_1 = 0;
      std::__cxx11::string::~string(local_f8);
      goto LAB_0019ecc2;
    }
  }
  local_1 = 1;
LAB_0019ecc2:
  return (bool)(local_1 & 1);
}

Assistant:

bool JointElement::setAttributes(const std::unordered_map<std::string, std::shared_ptr<XMLAttribute>>& attributes) {
        // attributes: name
        auto found = attributes.find("name");
        if (found != attributes.end()) {
            m_jointName = found->second->value();
        }
        found = attributes.find("type");
        if (found != attributes.end()) {
            m_jointType = found->second->value();
            // Explicitly check the supported types
            if (m_jointType != "fixed"
                && m_jointType != "revolute"
                && m_jointType != "continuous"
                && m_jointType != "prismatic")
            {
                std::string errStr = "Joint " + m_jointName + " has type " + m_jointType + " that is not currently supported by iDynTree.";
                reportError("JointElement", "setAttributes", errStr.c_str());
                return false;
            }
        }
        return true;
    }